

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reset.cpp
# Opt level: O1

void reset(int argc,char **argv)

{
  pointer pDVar1;
  bool bVar2;
  int iVar3;
  long *plVar4;
  undefined8 extraout_RAX;
  EVP_PKEY_CTX *pEVar5;
  long *plVar6;
  pointer pDVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string destination;
  string source;
  undefined1 local_120 [24];
  long lStack_108;
  EVP_PKEY_CTX *local_100;
  long local_f8;
  long local_f0;
  long lStack_e8;
  EVP_PKEY_CTX *local_e0;
  long local_d8;
  EVP_PKEY_CTX local_d0 [16];
  long *local_c0;
  long local_b8;
  long local_b0;
  long lStack_a8;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  if (argc < 1) {
    puts("add need 1 or more arguments");
    return;
  }
  std::__cxx11::string::string((string *)&local_e0,*argv,(allocator *)&local_100);
  pDVar1 = (pointer)(local_120 + 0x10);
  local_120._0_8_ = pDVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_120,STAGE_DIR_abi_cxx11_._M_dataplus._M_p,
             STAGE_DIR_abi_cxx11_._M_dataplus._M_p + STAGE_DIR_abi_cxx11_._M_string_length);
  std::__cxx11::string::append(local_120);
  plVar4 = (long *)std::__cxx11::string::_M_append(local_120,(ulong)local_e0);
  pEVar5 = (EVP_PKEY_CTX *)(plVar4 + 2);
  if ((EVP_PKEY_CTX *)*plVar4 == pEVar5) {
    local_f0 = *(long *)pEVar5;
    lStack_e8 = plVar4[3];
    local_100 = (EVP_PKEY_CTX *)&local_f0;
  }
  else {
    local_f0 = *(long *)pEVar5;
    local_100 = (EVP_PKEY_CTX *)*plVar4;
  }
  local_f8 = plVar4[1];
  *plVar4 = (long)pEVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if ((pointer)local_120._0_8_ != pDVar1) {
    operator_delete((void *)local_120._0_8_);
  }
  last_commit_hash_abi_cxx11_();
  hashToDir(&local_40,&local_60);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_40);
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_b0 = *plVar6;
    lStack_a8 = plVar4[3];
    local_c0 = &local_b0;
  }
  else {
    local_b0 = *plVar6;
    local_c0 = (long *)*plVar4;
  }
  local_b8 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_c0,(ulong)local_e0);
  pDVar7 = (pointer)(plVar4 + 2);
  if ((pointer)*plVar4 == pDVar7) {
    local_120._16_8_ = *(undefined8 *)pDVar7;
    lStack_108 = plVar4[3];
    local_120._0_8_ = pDVar1;
  }
  else {
    local_120._16_8_ = *(undefined8 *)pDVar7;
    local_120._0_8_ = (pointer)*plVar4;
  }
  local_120._8_8_ = plVar4[1];
  *plVar4 = (long)pDVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_e0,(string *)local_120);
  if ((pointer)local_120._0_8_ != pDVar1) {
    operator_delete((void *)local_120._0_8_);
  }
  if (local_c0 != &local_b0) {
    operator_delete(local_c0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  bVar2 = file_exists((char *)local_e0);
  if (bVar2) {
    bVar2 = file_exists((char *)local_100);
    if (!bVar2) {
      iVar3 = creat((char *)local_100,0x1ff);
      if (iVar3 == -1) {
        reset();
        std::vector<DiffLine,_std::allocator<DiffLine>_>::~vector
                  ((vector<DiffLine,_std::allocator<DiffLine>_> *)local_120);
        if (local_100 != (EVP_PKEY_CTX *)&local_f0) {
          operator_delete(local_100);
        }
        if (local_e0 != local_d0) {
          operator_delete(local_e0);
        }
        _Unwind_Resume(extraout_RAX);
      }
    }
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_80,local_e0,local_e0 + local_d8);
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_a0,local_100,local_100 + local_f8);
    diff_files((vector<DiffLine,_std::allocator<DiffLine>_> *)local_120,&local_80,&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p);
    }
    if (local_120._8_8_ == local_120._0_8_) {
      puts("Nothing to reset");
    }
    else {
      copy(local_e0,local_100);
    }
    std::vector<DiffLine,_std::allocator<DiffLine>_>::~vector
              ((vector<DiffLine,_std::allocator<DiffLine>_> *)local_120);
  }
  else {
    bVar2 = file_exists((char *)local_100);
    if (bVar2) {
      unlink((char *)local_100);
    }
    else {
      puts("Nothing to reset");
    }
  }
  if (local_100 != (EVP_PKEY_CTX *)&local_f0) {
    operator_delete(local_100);
  }
  if (local_e0 != local_d0) {
    operator_delete(local_e0);
  }
  return;
}

Assistant:

void reset(int argc, char *argv[]){
    if(argc < 1){
        printf("add need 1 or more arguments\n");
    }
    else{
        String source = argv[0];
        String destination = STAGE_DIR + "/" + source;
        source = hashToDir(last_commit_hash()) + "/" + source;
        if(file_exists(source.c_str())){
            if(!file_exists(destination.c_str())){
                if(creat(destination.c_str(),DEFAULT_PERM)==-1){
                    perror("creat");
                    exit(EXIT_FAILURE);
                }
            }
            Vector<DiffLine> result = diff_files(source,destination);
            if(result.size()>0){
                copy(source.c_str(),destination.c_str());
            }
            else{
                printf("Nothing to reset\n");
            }
        }
        else{
            if(file_exists(destination.c_str())){
                unlink(destination.c_str());
            }
            else{
                printf("Nothing to reset\n");
            }
        }
    }
}